

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateMergeFromCodedStream
          (StringFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  
  io::Printer::Print(printer,&this->variables_,
                     "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n      input, this->mutable_$name$()));\n"
                    );
  TVar1 = FieldDescriptor::type(this->descriptor_);
  if (TVar1 == TYPE_STRING) {
    GenerateUtf8CheckCodeForString
              (this->descriptor_,(this->super_FieldGenerator).options_,true,&this->variables_,
               "this->$name$().data(), this->$name$().length(),\n",printer);
    return;
  }
  return;
}

Assistant:

void StringFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  printer->Print(variables_,
    "DO_(::google::protobuf::internal::WireFormatLite::Read$declared_type$(\n"
    "      input, this->mutable_$name$()));\n");

  if (descriptor_->type() == FieldDescriptor::TYPE_STRING) {
    GenerateUtf8CheckCodeForString(
        descriptor_, options_, true, variables_,
        "this->$name$().data(), this->$name$().length(),\n", printer);
  }
}